

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_chroma_mode2
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  long lVar2;
  UWORD8 *pUVar3;
  ulong uVar4;
  UWORD8 *pUVar5;
  
  if (0 < nt) {
    pUVar1 = pu1_dst + 1;
    pUVar3 = pu1_ref + ((ulong)(uint)(nt * 4) - 4);
    uVar4 = 0;
    do {
      lVar2 = 0;
      pUVar5 = pUVar1;
      do {
        pUVar5[-1] = pUVar3[lVar2];
        *pUVar5 = pu1_ref[((int)uVar4 * -0x20 + -0x60 >> 5) + nt * 4 + (int)lVar2];
        pUVar5 = pUVar5 + dst_strd;
        lVar2 = lVar2 + -2;
      } while ((ulong)(uint)nt * 2 + lVar2 != 0);
      uVar4 = uVar4 + 2;
      pUVar1 = pUVar1 + 2;
      pUVar3 = pUVar3 + -2;
    } while (uVar4 < (uint)(nt * 2));
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode2(UWORD8 *pu1_ref,
                                   WORD32 src_strd,
                                   UWORD8 *pu1_dst,
                                   WORD32 dst_strd,
                                   WORD32 nt,
                                   WORD32 mode)
{
    WORD32 row, col;

    WORD32 intra_pred_ang = 32;
    WORD32 idx_u, idx_v;
    UNUSED(src_strd);
    UNUSED(mode);
    /* For the angle 45, replication is done from the corresponding angle */
    /* intra_pred_ang = tan(angle) in q5 format */
    for(col = 0; col < (2 * nt); col += 2)
    {
        idx_u = ((col + 1) * intra_pred_ang) >> 5; /* Use idx++ */
        idx_v = (((col + 1) + 1) * intra_pred_ang) >> 5; /* Use idx++ */
        for(row = 0; row < nt; row++)
        {
            pu1_dst[col + (row * dst_strd)] = pu1_ref[(4 * nt) - 2 * row - idx_u - 3];
            pu1_dst[(col + 1) + (row * dst_strd)] = pu1_ref[(4 * nt) - 2 * row - idx_v - 1];
        }
    }

}